

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O2

void mqtt_mq_clean(mqtt_message_queue *mq)

{
  void *__dest;
  uint8_t *__src;
  mqtt_queued_message *pmVar1;
  long lVar2;
  long *plVar3;
  mqtt_queued_message *pmVar4;
  mqtt_queued_message *pmVar5;
  size_t sVar6;
  long lVar7;
  mqtt_queued_message *pmVar8;
  size_t sVar9;
  size_t __n;
  bool bVar10;
  
  pmVar8 = (mqtt_queued_message *)mq->mem_end;
  lVar7 = 0;
  pmVar4 = pmVar8;
  do {
    pmVar5 = pmVar4 + -1;
    if (pmVar5 < mq->queue_tail) {
      pmVar4 = (mqtt_queued_message *)mq->mem_start;
      mq->curr = (uint8_t *)pmVar4;
      mq->queue_tail = pmVar8;
      goto LAB_001023e0;
    }
    lVar7 = lVar7 + 0x28;
    pmVar1 = pmVar4 + -1;
    pmVar4 = pmVar5;
  } while (pmVar1->state == MQTT_QUEUED_COMPLETE);
  if (lVar7 != 0x28) {
    __dest = mq->mem_start;
    __src = pmVar5->start;
    __n = (long)mq->curr - (long)__src;
    memmove(__dest,__src,__n);
    mq->curr = (uint8_t *)(__n + (long)mq->mem_start);
    lVar7 = (long)pmVar8 + (-lVar7 - (long)mq->queue_tail);
    lVar2 = lVar7 / 0x28;
    memmove((void *)((long)mq->mem_end + lVar2 * -0x28 + -0x28),mq->queue_tail,lVar7 + 0x28);
    plVar3 = (long *)mq->mem_end;
    pmVar8 = (mqtt_queued_message *)(plVar3 + lVar2 * -5 + -5);
    mq->queue_tail = pmVar8;
    lVar7 = -1;
    if (-1 < lVar2) {
      lVar7 = lVar2;
    }
    lVar7 = lVar7 + 1;
    while( true ) {
      plVar3 = plVar3 + -5;
      bVar10 = lVar7 == 0;
      lVar7 = lVar7 + -1;
      if (bVar10) break;
      *plVar3 = (long)__dest + (*plVar3 - (long)__src);
    }
    pmVar4 = (mqtt_queued_message *)mq->curr;
LAB_001023e0:
    sVar9 = (long)(pmVar8 + -1) - (long)pmVar4;
    sVar6 = 0;
    if (pmVar4 <= pmVar8 + -1 && sVar9 != 0) {
      sVar6 = sVar9;
    }
    mq->curr_sz = sVar6;
  }
  return;
}

Assistant:

void mqtt_mq_clean(struct mqtt_message_queue *mq) {
    struct mqtt_queued_message *new_head;

    for(new_head = mqtt_mq_get(mq, 0); new_head >= mq->queue_tail; --new_head) {
        if (new_head->state != MQTT_QUEUED_COMPLETE) break;
    }
    
    /* check if everything can be removed */
    if (new_head < mq->queue_tail) {
        mq->curr = (uint8_t *)mq->mem_start;
        mq->queue_tail = (struct mqtt_queued_message *)mq->mem_end;
        mq->curr_sz = (size_t) (mqtt_mq_currsz(mq));
        return;
    } else if (new_head == mqtt_mq_get(mq, 0)) {
        /* do nothing */
        return;
    }

    /* move buffered data */
    {
        size_t n = (size_t) (mq->curr - new_head->start);
        size_t removing = (size_t) (new_head->start - (uint8_t*) mq->mem_start);
        memmove(mq->mem_start, new_head->start, n);
        mq->curr = (unsigned char*)mq->mem_start + n;
      

        /* move queue */
        {
            ssize_t new_tail_idx = new_head - mq->queue_tail;
            memmove(mqtt_mq_get(mq, new_tail_idx), mq->queue_tail, sizeof(struct mqtt_queued_message) * (size_t) ((new_tail_idx + 1)));
            mq->queue_tail = mqtt_mq_get(mq, new_tail_idx);
          
            {
                /* bump back start's */
                ssize_t i = 0;
                for(; i < new_tail_idx + 1; ++i) {
                    mqtt_mq_get(mq, i)->start -= removing;
                }
            }
        }
    }

    /* get curr_sz */
    mq->curr_sz = (size_t) (mqtt_mq_currsz(mq));
}